

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall
IMLE<1,_1,_FastLinearExpert>::predictInverse(IMLE<1,_1,_FastLinearExpert> *this,X *x)

{
  double dVar1;
  bool bVar2;
  int worseSol;
  int newSol2;
  int newSol1;
  int local_2c;
  int local_28;
  int local_24;
  
  predictInverseSingle(this,x);
  dVar1 = *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (((dVar1 != 0.0) || (NAN(dVar1))) &&
     ((dVar1 = (this->param).multiValuedSignificance, dVar1 != 0.0 || (NAN(dVar1))))) {
    bVar2 = validInverseSolutions(this,&local_24,&local_28,&local_2c);
    if (!bVar2) {
      do {
        this->nInvSolFound = this->nInvSolFound + 1;
        clusterInverseSolutions(this,local_24,local_28,local_2c);
        getInverseSolutions(this);
        bVar2 = validInverseSolutions(this,&local_24,&local_28,&local_2c);
      } while (!bVar2);
    }
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverse(X const &x)
{
    predictInverseSingle(x);

    if( sum_p_x(0) == 0.0 || param.multiValuedSignificance == 0.0)
        return;

    int newSol1, newSol2, worseSol;
    while( !validInverseSolutions(newSol1, newSol2, worseSol) )
    {
        nInvSolFound++;
        clusterInverseSolutions(newSol1, newSol2, worseSol);
        getInverseSolutions();
    }
}